

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

size_t ckh_bucket_search(ckh_t *ckh,size_t bucket,void *key)

{
  void *pvVar1;
  _Bool _Var2;
  long lVar3;
  long lVar4;
  
  lVar4 = bucket << 6;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 4) {
      return 0xffffffffffffffff;
    }
    pvVar1 = *(void **)((long)&ckh->tab->key + lVar4);
    if ((pvVar1 != (void *)0x0) && (_Var2 = (*ckh->keycomp)(key,pvVar1), _Var2)) break;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return bucket * 4 + lVar3;
}

Assistant:

static size_t
ckh_bucket_search(ckh_t *ckh, size_t bucket, const void *key) {
	ckhc_t *cell;
	unsigned i;

	for (i = 0; i < (ZU(1) << LG_CKH_BUCKET_CELLS); i++) {
		cell = &ckh->tab[(bucket << LG_CKH_BUCKET_CELLS) + i];
		if (cell->key != NULL && ckh->keycomp(key, cell->key)) {
			return (bucket << LG_CKH_BUCKET_CELLS) + i;
		}
	}

	return SIZE_T_MAX;
}